

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::DeepTiledOutputFile::writeTiles
          (DeepTiledOutputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  int iVar1;
  TileMap *this_00;
  _Rb_tree_header *p_Var2;
  TileCoord *a;
  size_t *psVar3;
  pthread_mutex_t *__mutex;
  Data *pDVar4;
  pointer ppTVar5;
  TileBuffer *pTVar6;
  char *pixelData;
  uint64_t pixelDataSize;
  uint64_t unpackedDataSize;
  char *sampleCountTableData;
  uint64_t sampleCountTableSize;
  BufferedTile *this_01;
  _Rb_tree_node_base *p_Var7;
  bool bVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  TileBufferTask *pTVar13;
  uint64_t *puVar14;
  iterator iVar15;
  void *pvVar16;
  _Base_ptr p_Var17;
  _Rb_tree_node_base *p_Var18;
  ostream *poVar19;
  ArgExc *pAVar20;
  IoExc *this_02;
  int iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  long lVar26;
  TileCoord *__y;
  TileCoord *__y_00;
  _Rb_tree_node_base *p_Var27;
  _Rb_tree_node_base *p_Var28;
  string *psVar29;
  _Rb_tree_node_base *__x;
  string *psVar30;
  ulong uVar31;
  ulong __n;
  uint uVar32;
  _Base_ptr p_Var33;
  TileCoord TVar34;
  undefined1 auVar35 [16];
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar36;
  int local_3d4;
  uint local_3cc;
  TileCoord currentTile;
  stringstream _iex_throw_s;
  ostream local_330 [376];
  TaskGroup taskGroup;
  int iVar25;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar9 = pthread_mutex_lock(__mutex);
  if (iVar9 != 0) {
    std::__throw_system_error(iVar9);
  }
  pDVar4 = this->_data;
  if ((pDVar4->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar4->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar20,"No frame buffer specified as pixel data source.");
  }
  else {
    bVar8 = isValidTile(this,dx1,dy1,lx,ly);
    if ((bVar8) && (bVar8 = isValidTile(this,dx2,dy2,lx,ly), bVar8)) {
      if (((ly | lx) < 0) ||
         ((((lx != ly && ((pDVar4->tileDesc).mode == MIPMAP_LEVELS)) || (pDVar4->numXLevels <= lx))
          || (pDVar4->numYLevels <= ly)))) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        std::__ostream_insert<char,std::char_traits<char>>(local_330,"Level coordinate (",0x12);
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_330,lx);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,") is invalid.",0xd);
        pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar20,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      iVar9 = dx2;
      if (dx2 < dx1) {
        iVar9 = dx1;
      }
      lVar11 = (long)dx2;
      if (dx1 < dx2) {
        dx2 = dx1;
      }
      iVar21 = dy2;
      if (dy2 < dy1) {
        iVar21 = dy1;
      }
      lVar26 = (long)dy2;
      if (dy1 < dy2) {
        dy2 = dy1;
      }
      bVar8 = pDVar4->lineOrder != DECREASING_Y;
      local_3d4 = dy2;
      if (!bVar8) {
        local_3d4 = iVar21;
      }
      lVar11 = dx1 - lVar11;
      lVar12 = -lVar11;
      if (0 < lVar11) {
        lVar12 = lVar11;
      }
      lVar26 = dy1 - lVar26;
      lVar11 = -lVar26;
      if (0 < lVar26) {
        lVar11 = lVar26;
      }
      uVar23 = ((int)lVar11 + 1) * ((int)lVar12 + 1);
      uVar32 = (uint)((ulong)((long)(pDVar4->tileBuffers).
                                    super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pDVar4->tileBuffers).
                                   super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((int)uVar23 < (int)uVar32) {
        uVar32 = uVar23;
      }
      IlmThread_3_4::TaskGroup::TaskGroup(&taskGroup);
      iVar10 = (uint)bVar8 * 2 + -1;
      iVar24 = local_3d4;
      iVar21 = dx2;
      if ((int)uVar32 < 1) {
        local_3cc = 0;
      }
      else {
        local_3cc = 0;
        do {
          pTVar13 = (TileBufferTask *)operator_new(0x20);
          anon_unknown_8::TileBufferTask::TileBufferTask
                    (pTVar13,&taskGroup,this->_data,local_3cc,iVar21,iVar24,lx,ly);
          IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pTVar13);
          local_3cc = local_3cc + 1;
          iVar1 = iVar21 + 1;
          bVar8 = iVar21 < iVar9;
          iVar25 = iVar10;
          iVar21 = dx2;
          if (bVar8) {
            iVar25 = 0;
            iVar21 = iVar1;
          }
          iVar24 = iVar25 + iVar24;
        } while (uVar32 != local_3cc);
      }
      if (0 < (int)uVar23) {
        uVar31 = 0;
        iVar1 = dx2;
        do {
          ppTVar5 = (this->_data->tileBuffers).
                    super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar6 = ppTVar5[uVar31 % (ulong)((long)(this->_data->tileBuffers).
                                                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)ppTVar5 >> 3)];
          IlmThread_3_4::Semaphore::wait();
          pDVar4 = this->_data;
          pixelData = pTVar6->dataPtr;
          pixelDataSize = pTVar6->dataSize;
          unpackedDataSize = pTVar6->uncompressedSize;
          sampleCountTableData = pTVar6->sampleCountTablePtr;
          sampleCountTableSize = pTVar6->sampleCountTableSize;
          puVar14 = TileOffsets::operator()(&pDVar4->tileOffsets,iVar1,local_3d4,lx,ly);
          if (*puVar14 != 0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_330,"Attempt to write tile (",0x17);
            poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
            poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,local_3d4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
            poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,lx);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
            poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,") more than once.",0x11);
            pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
            __cxa_throw(pAVar20,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
          }
          if (pDVar4->lineOrder == RANDOM_Y) {
            anon_unknown_8::writeTileData
                      (pDVar4,iVar1,local_3d4,lx,ly,pixelData,pixelDataSize,unpackedDataSize,
                       sampleCountTableData,sampleCountTableSize);
          }
          else {
            currentTile.dy = local_3d4;
            currentTile.ly = ly;
            this_00 = &pDVar4->tileMap;
            currentTile.dx = iVar1;
            currentTile.lx = lx;
            iVar15 = std::
                     map<Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                     ::find(this_00,&currentTile);
            p_Var2 = &(pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)iVar15._M_node != p_Var2) {
              iex_debugTrap();
              std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_330,"Attempt to write tile (",0x17);
              poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
              poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,local_3d4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
              poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,lx);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
              poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,") more than once.",0x11);
              pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
              __cxa_throw(pAVar20,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
            }
            if ((((pDVar4->nextTileToWrite).lx == lx) && ((pDVar4->nextTileToWrite).ly == ly)) &&
               ((a = &pDVar4->nextTileToWrite, a->dx == iVar1 &&
                ((pDVar4->nextTileToWrite).dy == local_3d4)))) {
              anon_unknown_8::writeTileData
                        (pDVar4,iVar1,local_3d4,lx,ly,pixelData,pixelDataSize,unpackedDataSize,
                         sampleCountTableData,sampleCountTableSize);
              TVar34 = Data::nextTileCoord(pDVar4,a);
              pDVar4->nextTileToWrite = TVar34;
              iVar15 = std::
                       map<Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                       ::find(this_00,a);
              while ((_Rb_tree_header *)iVar15._M_node != p_Var2) {
                p_Var33 = iVar15._M_node[1]._M_left;
                anon_unknown_8::writeTileData
                          (pDVar4,iVar15._M_node[1]._M_color,*(int *)&iVar15._M_node[1].field_0x4,
                           *(int *)&iVar15._M_node[1]._M_parent,
                           *(int *)((long)&iVar15._M_node[1]._M_parent + 4),*(char **)p_Var33,
                           (uint64_t)p_Var33->_M_parent,(uint64_t)p_Var33->_M_left,
                           (char *)p_Var33->_M_right,*(uint64_t *)(p_Var33 + 1));
                this_01 = (BufferedTile *)iVar15._M_node[1]._M_left;
                if (this_01 != (BufferedTile *)0x0) {
                  anon_unknown_8::BufferedTile::~BufferedTile(this_01);
                  operator_delete(this_01,0x28);
                }
                pvVar16 = (void *)std::_Rb_tree_rebalance_for_erase
                                            (iVar15._M_node,&p_Var2->_M_header);
                operator_delete(pvVar16,0x38);
                psVar3 = &(pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                *psVar3 = *psVar3 - 1;
                TVar34 = Data::nextTileCoord(pDVar4,a);
                pDVar4->nextTileToWrite = TVar34;
                iVar15 = std::
                         map<Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                         ::find(this_00,a);
              }
            }
            else {
              p_Var17 = (_Base_ptr)operator_new(0x28);
              *(undefined8 *)p_Var17 = 0;
              p_Var33 = (_Base_ptr)(long)(int)pixelDataSize;
              p_Var17->_M_parent = p_Var33;
              p_Var17->_M_left = (_Base_ptr)(long)(int)unpackedDataSize;
              p_Var17->_M_right = (_Base_ptr)0x0;
              __n = (ulong)(int)sampleCountTableSize;
              *(ulong *)(p_Var17 + 1) = __n;
              pvVar16 = operator_new__((ulong)p_Var33);
              *(void **)p_Var17 = pvVar16;
              memcpy(pvVar16,pixelData,(size_t)p_Var33);
              p_Var33 = (_Base_ptr)operator_new__(__n);
              p_Var17->_M_right = p_Var33;
              memcpy(p_Var33,sampleCountTableData,__n);
              p_Var33 = (pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var28 = &p_Var2->_M_header;
              for (; p_Var33 != (_Base_ptr)0x0; p_Var33 = (&p_Var33->_M_left)[bVar8]) {
                iVar25 = *(int *)((long)&p_Var33[1]._M_parent + 4);
                bVar8 = true;
                if (ly <= iVar25) {
                  if (iVar25 == ly) {
                    iVar25 = *(int *)&p_Var33[1]._M_parent;
                    bVar8 = iVar25 < lx;
                    if (lx <= iVar25) {
                      if (iVar25 != lx) goto LAB_001739dc;
                      bVar8 = true;
                      if (local_3d4 <= *(int *)&p_Var33[1].field_0x4) {
                        if (*(int *)&p_Var33[1].field_0x4 != local_3d4) goto LAB_001739dc;
                        bVar8 = (int)p_Var33[1]._M_color < iVar1;
                      }
                    }
                  }
                  else {
LAB_001739dc:
                    bVar8 = false;
                  }
                }
                if (bVar8 == false) {
                  p_Var28 = p_Var33;
                }
              }
              if (((_Rb_tree_header *)p_Var28 == p_Var2) ||
                 (iVar25 = *(int *)((long)&p_Var28[1]._M_parent + 4), ly < iVar25)) {
LAB_00173a01:
                p_Var18 = (_Rb_tree_node_base *)operator_new(0x38);
                __x = p_Var18 + 1;
                *(ulong *)(p_Var18 + 1) = CONCAT44(currentTile.dy,currentTile.dx);
                p_Var18[1]._M_parent = (_Base_ptr)CONCAT44(currentTile.ly,currentTile.lx);
                p_Var18[1]._M_left = (_Base_ptr)0x0;
                if ((_Rb_tree_header *)p_Var28 == p_Var2) {
                  if ((pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                    p_Var33 = (pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_right;
                    bVar8 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                      ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                       (p_Var33 + 1),(TileCoord *)__x,__y);
                    if (bVar8) {
LAB_00173b2a:
                      auVar35._8_8_ = 0;
                      auVar35._0_8_ = p_Var33;
                      pVar36 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)
                               (auVar35 << 0x40);
                      goto LAB_00173b72;
                    }
                  }
LAB_00173b62:
                  pVar36 = std::
                           _Rb_tree<Imf_3_4::(anonymous_namespace)::TileCoord,_std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>,_std::_Select1st<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                           ::_M_get_insert_unique_pos(&this_00->_M_t,(key_type *)__x);
                }
                else {
                  bVar8 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x,
                                     (TileCoord *)(p_Var28 + 1),__y);
                  if (bVar8) {
                    p_Var33 = (pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                    ;
                    pVar36.second = p_Var33;
                    pVar36.first = p_Var33;
                    if (p_Var33 != p_Var28) {
                      auVar35 = std::_Rb_tree_decrement(p_Var28);
                      p_Var27 = auVar35._0_8_;
                      bVar8 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                        ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                         (p_Var27 + 1),(TileCoord *)__x,auVar35._8_8_);
                      if (!bVar8) goto LAB_00173b62;
                      p_Var7 = p_Var28;
                      if (p_Var27->_M_right == (_Base_ptr)0x0) {
                        p_Var28 = p_Var27;
                        p_Var7 = (_Rb_tree_node_base *)0x0;
                      }
                      pVar36.second = p_Var28;
                      pVar36.first = p_Var7;
                    }
                  }
                  else {
                    bVar8 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                      ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                       (p_Var28 + 1),(TileCoord *)__x,__y_00);
                    if (bVar8) {
                      p_Var33 = (pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_right;
                      if (p_Var33 == p_Var28) goto LAB_00173b2a;
                      auVar35 = std::_Rb_tree_increment(p_Var28);
                      p_Var27 = auVar35._0_8_;
                      bVar8 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                        ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x,
                                         (TileCoord *)(p_Var27 + 1),auVar35._8_8_);
                      if (!bVar8) goto LAB_00173b62;
                      p_Var7 = p_Var27;
                      if (p_Var28->_M_right == (_Base_ptr)0x0) {
                        p_Var27 = p_Var28;
                        p_Var7 = (_Rb_tree_node_base *)0x0;
                      }
                      pVar36.second = p_Var27;
                      pVar36.first = p_Var7;
                    }
                    else {
                      pVar36.second = (_Rb_tree_node_base *)0x0;
                      pVar36.first = p_Var28;
                    }
                  }
                }
LAB_00173b72:
                p_Var27 = pVar36.second;
                p_Var28 = pVar36.first;
                if (p_Var27 == (_Rb_tree_node_base *)0x0) {
                  operator_delete(p_Var18,0x38);
                }
                else {
                  bVar8 = true;
                  if ((p_Var28 == (_Rb_tree_node_base *)0x0) &&
                     (p_Var2 != (_Rb_tree_header *)p_Var27)) {
                    bVar8 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                      ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x,
                                       (TileCoord *)(p_Var27 + 1),(TileCoord *)p_Var27);
                  }
                  std::_Rb_tree_insert_and_rebalance(bVar8,p_Var18,p_Var27,&p_Var2->_M_header);
                  psVar3 = &(pDVar4->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                  *psVar3 = *psVar3 + 1;
                  p_Var28 = p_Var18;
                }
              }
              else if (iVar25 == ly) {
                iVar25 = *(int *)&p_Var28[1]._M_parent;
                bVar8 = lx < iVar25;
                if (lx < iVar25) {
LAB_00173aa7:
                  if (bVar8) goto LAB_00173a01;
                }
                else if (iVar25 == lx) {
                  if (local_3d4 < *(int *)&p_Var28[1].field_0x4) goto LAB_00173a01;
                  if (*(int *)&p_Var28[1].field_0x4 == local_3d4) {
                    bVar8 = iVar1 < (int)p_Var28[1]._M_color;
                    goto LAB_00173aa7;
                  }
                }
              }
              p_Var28[1]._M_left = p_Var17;
            }
          }
          IlmThread_3_4::Semaphore::post();
          if ((int)local_3cc < (int)uVar23) {
            pTVar13 = (TileBufferTask *)operator_new(0x20);
            anon_unknown_8::TileBufferTask::TileBufferTask
                      (pTVar13,&taskGroup,this->_data,local_3cc,iVar21,iVar24,lx,ly);
            IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pTVar13);
          }
          uVar31 = uVar31 + 1;
          iVar25 = iVar1 + 1;
          if (iVar9 <= iVar1) {
            iVar25 = dx2;
          }
          iVar22 = iVar10;
          if (iVar1 < iVar9) {
            iVar22 = 0;
          }
          local_3d4 = local_3d4 + iVar22;
          local_3cc = local_3cc + 1;
          iVar22 = iVar21 + 1;
          bVar8 = iVar21 < iVar9;
          iVar1 = iVar10;
          iVar21 = dx2;
          if (bVar8) {
            iVar1 = 0;
            iVar21 = iVar22;
          }
          iVar24 = iVar24 + iVar1;
          iVar1 = iVar25;
        } while (uVar31 != uVar23);
      }
      IlmThread_3_4::TaskGroup::~TaskGroup(&taskGroup);
      ppTVar5 = (this->_data->tileBuffers).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = (long)(this->_data->tileBuffers).
                     super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5;
      if (lVar11 == 0) {
        psVar29 = (string *)0x0;
      }
      else {
        lVar11 = lVar11 >> 3;
        lVar26 = 0;
        psVar30 = (string *)0x0;
        do {
          pTVar6 = ppTVar5[lVar26];
          psVar29 = (string *)&pTVar6->exception;
          if (psVar30 != (string *)0x0) {
            psVar29 = psVar30;
          }
          if (pTVar6->hasException == false) {
            psVar29 = psVar30;
          }
          pTVar6->hasException = false;
          lVar26 = lVar26 + 1;
          psVar30 = psVar29;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar26);
      }
      if (psVar29 == (string *)0x0) {
        pthread_mutex_unlock(__mutex);
        return;
      }
      this_02 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(this_02,psVar29);
      __cxa_throw(this_02,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar20,"Tile coordinates are invalid.");
  }
  __cxa_throw(pAVar20,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledOutputFile::writeTiles (
    int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif

        if (_data->slices.size () == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                                         "as pixel data source.");

        if (!isValidTile (dx1, dy1, lx, ly) || !isValidTile (dx2, dy2, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Tile coordinates are invalid.");

        if (!isValidLevel (lx, ly))
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Level coordinate "
                "(" << lx
                    << ", " << ly
                    << ") "
                       "is invalid.");
        //
        // Determine the first and last tile coordinates in both dimensions
        // based on the file's lineOrder
        //

        if (dx1 > dx2) swap (dx1, dx2);

        if (dy1 > dy2) swap (dy1, dy2);

        int dyStart = dy1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dY      = -1;
        }

        int numTiles = (dx2 - dx1 + 1) * (dy2 - dy1 + 1);
        int numTasks = min ((int) _data->tileBuffers.size (), numTiles);

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;

            //
            // Add in the initial compression tasks to the thread pool
            //

            int nextCompBuffer = 0;
            int dxComp         = dx1;
            int dyComp         = dyStart;

            while (nextCompBuffer < numTasks)
            {
                ThreadPool::addGlobalTask (new TileBufferTask (
                    &taskGroup,
                    _data,
                    nextCompBuffer++,
                    dxComp,
                    dyComp,
                    lx,
                    ly));
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // Write the compressed buffers and add in more compression
            // tasks until done
            //

            int nextWriteBuffer = 0;
            int dxWrite         = dx1;
            int dyWrite         = dyStart;

            while (nextWriteBuffer < numTiles)
            {
                //
                // Wait until the nextWriteBuffer is ready to be written
                //

                TileBuffer* writeBuffer =
                    _data->getTileBuffer (nextWriteBuffer);

                writeBuffer->wait ();

                //
                // Write the tilebuffer
                //

                bufferedTileWrite (
                    _data,
                    dxWrite,
                    dyWrite,
                    lx,
                    ly,
                    writeBuffer->dataPtr,
                    writeBuffer->dataSize,
                    writeBuffer->uncompressedSize,
                    writeBuffer->sampleCountTablePtr,
                    writeBuffer->sampleCountTableSize);

                //
                // Release the lock on nextWriteBuffer
                //

                writeBuffer->post ();

                //
                // If there are no more tileBuffers to compress, then
                // only continue to write out remaining tileBuffers,
                // otherwise keep adding compression tasks.
                //

                if (nextCompBuffer < numTiles)
                {
                    //
                    // add nextCompBuffer as a compression Task
                    //

                    ThreadPool::addGlobalTask (new TileBufferTask (
                        &taskGroup,
                        _data,
                        nextCompBuffer,
                        dxComp,
                        dyComp,
                        lx,
                        ly));
                }

                nextWriteBuffer++;
                dxWrite++;

                if (dxWrite > dx2)
                {
                    dxWrite = dx1;
                    dyWrite += dY;
                }

                nextCompBuffer++;
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exception handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledOutputFile::writeTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string* exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size (); ++i)
        {
            TileBuffer* tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception) throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Failed to write pixel data to image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}